

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

art_node_t * art_node48_insert(art_node48_t *node,art_node_t *child,uint8_t key)

{
  byte bVar1;
  ulong uVar2;
  art_node48_t *paVar3;
  long lVar4;
  short sVar5;
  ulong uVar6;
  
  bVar1 = node->count;
  if (bVar1 < 0x30) {
    uVar6 = node->available_children;
    uVar2 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    node->keys[key] = (uint8_t)uVar2;
    node->children[uVar2] = child;
    node->count = bVar1 + 1;
    node->available_children = uVar6 & ~(1L << (uVar2 & 0x3f));
    paVar3 = node;
  }
  else {
    bVar1 = (node->base).prefix_size;
    paVar3 = (art_node48_t *)(*global_memory_hook.malloc)(0x810);
    (paVar3->base).typecode = '\x03';
    (paVar3->base).prefix_size = bVar1;
    memcpy((paVar3->base).prefix,(node->base).prefix,(ulong)bVar1);
    *(undefined2 *)&paVar3->available_children = 0;
    for (lVar4 = 2; lVar4 != 0x102; lVar4 = lVar4 + 1) {
      *(undefined8 *)((long)&paVar3->base + lVar4 * 8) = 0;
    }
    sVar5 = 0;
    for (lVar4 = 0x10; lVar4 != 0x110; lVar4 = lVar4 + 1) {
      uVar6 = (ulong)(node->base).prefix[lVar4 + -2];
      if (uVar6 != 0x30) {
        *(art_node_t **)((long)&paVar3->base + lVar4 * 8 + -0x70) = node->children[uVar6];
        sVar5 = sVar5 + 1;
        *(short *)&paVar3->available_children = sVar5;
      }
    }
    (*global_memory_hook.free)(node);
    *(art_node_t **)(paVar3->keys + (ulong)key * 8) = child;
    *(short *)&paVar3->available_children = (short)paVar3->available_children + 1;
  }
  return (art_node_t *)paVar3;
}

Assistant:

static art_node_t *art_node48_insert(art_node48_t *node, art_node_t *child,
                                     uint8_t key) {
    if (node->count < 48) {
        // node->available_children is only zero when the node is full (count ==
        // 48), we just checked count < 48
        uint8_t val_idx = roaring_trailing_zeroes(node->available_children);
        node->keys[key] = val_idx;
        node->children[val_idx] = child;
        node->count++;
        node->available_children &= ~(UINT64_C(1) << val_idx);
        return (art_node_t *)node;
    }
    art_node256_t *new_node =
        art_node256_create(node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 256; ++i) {
        uint8_t val_idx = node->keys[i];
        if (val_idx != ART_NODE48_EMPTY_VAL) {
            art_node256_insert(new_node, node->children[val_idx], i);
        }
    }
    roaring_free(node);
    return art_node256_insert(new_node, child, key);
}